

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_kernel.h
# Opt level: O0

t_symbol * gensym(char *string)

{
  bool bVar1;
  pointer ppVar2;
  long lVar3;
  char *__dest;
  char *__src;
  mapped_type *pmVar4;
  t_symbol symbol;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>,_true>
  local_58;
  t_mock_symboliter i;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string s;
  char *string_local;
  
  s.field_2._8_8_ = string;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,string,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
               *)c74::max::mock_symboltable_abi_cxx11_,(key_type *)local_38);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
              *)c74::max::mock_symboltable_abi_cxx11_);
  bVar1 = std::__detail::operator!=(&local_58,&local_60);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>,_false,_true>
                           *)&local_58);
    string_local = (char *)&ppVar2->second;
  }
  else {
    lVar3 = std::__cxx11::string::size();
    __dest = (char *)operator_new__(lVar3 + 1);
    __src = (char *)std::__cxx11::string::c_str();
    lVar3 = std::__cxx11::string::size();
    strncpy(__dest,__src,lVar3 + 1);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
                           *)c74::max::mock_symboltable_abi_cxx11_,(key_type *)local_38);
    pmVar4->s_name = __dest;
    pmVar4->s_thing = (t_object *)0x0;
    string_local = (char *)std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
                           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::max::t_symbol>_>_>
                                         *)c74::max::mock_symboltable_abi_cxx11_,
                                        (key_type *)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return (t_symbol *)string_local;
}

Assistant:

MOCK_EXPORT t_symbol* gensym(const char* string)
{
    std::string			s(string);
    t_mock_symboliter	i = mock_symboltable.find(s);

    if (i != mock_symboltable.end())
        return (t_symbol*)&i->second;
    else {
        t_symbol	symbol;

        symbol.s_name = new char[s.size()+1];
        symbol.s_thing = 0;
        strncpy((char*)symbol.s_name, s.c_str(), s.size()+1);

        mock_symboltable[s] = symbol;
        return &mock_symboltable[s];
    }
}